

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O2

vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
* Test_Helper::uniformImages
            (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *__return_storage_ptr__,uint32_t count,uint32_t width,uint32_t height)

{
  pointer this;
  ImageTemplate<unsigned_char> local_80;
  Image local_58;
  
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(__return_storage_ptr__,(ulong)count,(allocator_type *)&local_58);
  for (this = (__return_storage_ptr__->
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      this != (__return_storage_ptr__->
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              )._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,0,0,'\x01','\x01');
    uniformImage(&local_58,width,height,&local_80);
    PenguinV_Image::ImageTemplate<unsigned_char>::swap(this,&local_58);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< PenguinV_Image::Image > uniformImages( uint32_t count, uint32_t width, uint32_t height )
    {
        std::vector < PenguinV_Image::Image > image( count );

        for( std::vector< PenguinV_Image::Image >::iterator im = image.begin(); im != image.end(); ++im )
            *im = uniformImage( width, height );

        return image;
    }